

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

bool gl4cts::EnhancedLayouts::Utils::checkVarying
               (Program *program,Variable *variable,stringstream *stream,bool is_input)

{
  Interface *pIVar1;
  bool bVar2;
  Descriptor *pDVar3;
  reference desc;
  allocator<char> local_f1;
  string local_f0;
  undefined1 local_c9;
  reference pvStack_c8;
  bool member_result_2;
  Descriptor *member_2;
  GLuint i_2;
  bool member_result_1;
  Descriptor *member_1;
  size_t j;
  char local_98 [8];
  GLchar buffer [16];
  undefined1 local_80 [4];
  GLuint i_1;
  string structVariable;
  size_t n_members_1;
  Interface *interface_1;
  bool member_result;
  Descriptor *member;
  size_t i;
  size_t n_members;
  Interface *interface;
  bool result;
  bool is_input_local;
  stringstream *stream_local;
  Variable *variable_local;
  Program *program_local;
  
  interface._6_1_ = true;
  bVar2 = Variable::IsBlock(variable);
  if (bVar2) {
    pIVar1 = (variable->m_descriptor).field_9.m_interface;
    pDVar3 = (Descriptor *)
             std::
             vector<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor>_>
             ::size(&pIVar1->m_members);
    for (member = (Descriptor *)0x0; member < pDVar3;
        member = (Descriptor *)((long)&member->m_expected_component + 1)) {
      desc = std::
             vector<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor>_>
             ::operator[](&pIVar1->m_members,(size_type)member);
      bVar2 = verifyVarying(program,&pIVar1->m_name,desc,stream,is_input);
      if (!bVar2) {
        interface._6_1_ = false;
      }
    }
  }
  else {
    bVar2 = Variable::IsStruct(variable);
    if (bVar2) {
      pIVar1 = (variable->m_descriptor).field_9.m_interface;
      structVariable.field_2._8_8_ =
           std::
           vector<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor>_>
           ::size(&pIVar1->m_members);
      std::__cxx11::string::string((string *)local_80,(string *)&(variable->m_descriptor).m_name);
      if ((variable->m_descriptor).m_n_array_elements == 0) {
        for (member_2._0_4_ = 0; (ulong)(uint)member_2 < (ulong)structVariable.field_2._8_8_;
            member_2._0_4_ = (uint)member_2 + 1) {
          pvStack_c8 = std::
                       vector<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor>_>
                       ::operator[](&pIVar1->m_members,(ulong)(uint)member_2);
          local_c9 = verifyVarying(program,(string *)local_80,pvStack_c8,stream,is_input);
          if (!(bool)local_c9) {
            interface._6_1_ = false;
          }
        }
      }
      else {
        buffer[0xc] = '\0';
        buffer[0xd] = '\0';
        buffer[0xe] = '\0';
        buffer[0xf] = '\0';
        for (; (uint)buffer._12_4_ < (variable->m_descriptor).m_n_array_elements;
            buffer._12_4_ = buffer._12_4_ + 1) {
          sprintf(local_98,"%d",(ulong)(uint)buffer._12_4_);
          std::__cxx11::string::append(local_80);
          std::__cxx11::string::append(local_80);
          std::__cxx11::string::append(local_80);
          for (member_1 = (Descriptor *)0x0; member_1 < (ulong)structVariable.field_2._8_8_;
              member_1 = (Descriptor *)((long)&member_1->m_expected_component + 1)) {
            _i_2 = std::
                   vector<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor>_>
                   ::operator[](&pIVar1->m_members,(size_type)member_1);
            member_2._7_1_ = verifyVarying(program,(string *)local_80,_i_2,stream,is_input);
            if (!(bool)member_2._7_1_) {
              interface._6_1_ = false;
            }
          }
        }
      }
      std::__cxx11::string::~string((string *)local_80);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"",&local_f1);
      interface._6_1_ = verifyVarying(program,&local_f0,&variable->m_descriptor,stream,is_input);
      std::__cxx11::string::~string((string *)&local_f0);
      std::allocator<char>::~allocator(&local_f1);
    }
  }
  return interface._6_1_;
}

Assistant:

bool checkVarying(Program& program, const Variable& variable, std::stringstream& stream, bool is_input)
{
	bool result = true;

	if (variable.IsBlock())
	{
		Utils::Interface* interface = variable.m_descriptor.m_interface;
		const size_t	  n_members = interface->m_members.size();

		for (size_t i = 0; i < n_members; ++i)
		{
			const Variable::Descriptor& member = interface->m_members[i];
			bool member_result				   = verifyVarying(program, interface->m_name, member, stream, is_input);

			if (false == member_result)
			{
				result = false;
			}
		}
	}
	/*
	 To query the the location of struct member by glGetProgramResource, we need pass the variable name "gs_fs_output[0].single",
	 but in original implementation, the test pass the name "Data.single", which can't get any valid result.
	 struct Data {
	 dmat2 single;
	 dmat2 array[1];
	 };
	 layout (location = 0) in Data gs_fs_output[1];
	 */
	else if (variable.IsStruct())
	{
		Utils::Interface* interface		 = variable.m_descriptor.m_interface;
		const size_t	  n_members		 = interface->m_members.size();
		std::string		  structVariable = variable.m_descriptor.m_name;
		// If struct variable is an array
		if (0 != variable.m_descriptor.m_n_array_elements)
		{
			for (GLuint i = 0; i < variable.m_descriptor.m_n_array_elements; i++)
			{
				GLchar buffer[16];
				sprintf(buffer, "%d", i);
				structVariable.append("[");
				structVariable.append(buffer);
				structVariable.append("]");
				for (size_t j = 0; j < n_members; ++j)
				{
					const Variable::Descriptor& member = interface->m_members[j];
					bool member_result = verifyVarying(program, structVariable, member, stream, is_input);

					if (false == member_result)
					{
						result = false;
					}
				}
			}
		}
		else
		{
			for (GLuint i = 0; i < n_members; ++i)
			{
				const Variable::Descriptor& member = interface->m_members[i];
				bool member_result				   = verifyVarying(program, structVariable, member, stream, is_input);

				if (false == member_result)
				{
					result = false;
				}
			}
		}
	}
	else
	{
		result = verifyVarying(program, "", variable.m_descriptor, stream, is_input);
	}
	return result;
}